

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O2

unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> __thiscall
node::BlockAssembler::CreateNewBlock(BlockAssembler *this,CScript *scriptPubKeyIn)

{
  long lVar1;
  CBlock *block;
  char *pcVar2;
  string_view source_file;
  string_view source_file_00;
  bool bVar3;
  int32_t iVar4;
  uint uVar5;
  long lVar6;
  CBlockTemplate *this_00;
  int64_t iVar7;
  time_point tVar8;
  long lVar9;
  CAmount CVar10;
  CScript *this_01;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  size_t sVar11;
  size_t sVar12;
  Logger *pLVar13;
  long lVar14;
  runtime_error *this_02;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RDX;
  CBlockIndex *pindexPrev;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe40;
  double local_198;
  double local_190;
  double local_188;
  CMutableTransaction coinbaseTx;
  int nDescendantsUpdated;
  int nPackagesSelected;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  BlockValidationState state;
  long local_d8 [12];
  string local_78;
  string log_msg_1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = std::chrono::_V2::steady_clock::now();
  resetBlock((BlockAssembler *)scriptPubKeyIn);
  this_00 = (CBlockTemplate *)operator_new(0xb8);
  memset(this_00,0,0xb8);
  CBlockTemplate::CBlockTemplate(this_00);
  std::__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::reset
            ((__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             scriptPubKeyIn,this_00);
  block = *(CBlock **)&(scriptPubKeyIn->super_CScriptBase)._union;
  if (block == (CBlock *)0x0) {
    (this->pblocktemplate)._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl = (CBlockTemplate *)0x0;
  }
  else {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::emplace_back<>(&block->vtx);
    state.super_ValidationState<BlockValidationResult>.m_mode = ~M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = ~BLOCK_RESULT_UNSET;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              ((vector<long,_std::allocator<long>_> *)
               ((scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect + 0x70),
               (long *)&state);
    state.super_ValidationState<BlockValidationResult>.m_mode = ~M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = ~BLOCK_RESULT_UNSET;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              ((vector<long,_std::allocator<long>_> *)
               ((scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect + 0x88),
               (long *)&state);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock10,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
               ,0x7f,false);
    lVar9 = *(long *)((long)&scriptPubKeyIn[4].super_CScriptBase._union + 0x10);
    if ((*(long *)(lVar9 + 0x60) == *(long *)(lVar9 + 0x58)) ||
       (pindexPrev = *(CBlockIndex **)(*(long *)(lVar9 + 0x60) + -8),
       pindexPrev == (CBlockIndex *)0x0)) {
      __assert_fail("pindexPrev != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
                    ,0x81,
                    "std::unique_ptr<CBlockTemplate> node::BlockAssembler::CreateNewBlock(const CScript &)"
                   );
    }
    *(int *)((long)&scriptPubKeyIn[3].super_CScriptBase._union + 0x10) = pindexPrev->nHeight + 1;
    iVar4 = VersionBitsCache::ComputeBlockVersion
                      ((VersionBitsCache *)(*(long *)(lVar9 + 0x50) + 0xd08),pindexPrev,
                       (Params *)
                       scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.indirect);
    (block->super_CBlockHeader).nVersion = iVar4;
    if (scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.indirect[0xfa] == '\x01') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&state,"-blockversion",(allocator<char> *)&coinbaseTx);
      iVar7 = ArgsManager::GetIntArg
                        (&gArgs,(string *)&state,(long)(block->super_CBlockHeader).nVersion);
      (block->super_CBlockHeader).nVersion = (int32_t)iVar7;
      std::__cxx11::string::~string((string *)&state);
    }
    tVar8 = NodeClock::now();
    (block->super_CBlockHeader).nTime = (uint32_t)((long)tVar8.__d.__r / 1000000000);
    iVar7 = CBlockIndex::GetMedianTimePast(pindexPrev);
    *(int64_t *)((long)&scriptPubKeyIn[3].super_CScriptBase._union + 0x18) = iVar7;
    nPackagesSelected = 0;
    nDescendantsUpdated = 0;
    lVar9 = *(long *)((long)&scriptPubKeyIn[4].super_CScriptBase._union + 8);
    if (lVar9 != 0) {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&state,
                 (AnnotatedMixin<std::recursive_mutex> *)(lVar9 + 0x58),"m_mempool->cs",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
                 ,0x91,false);
      addPackageTxs((BlockAssembler *)scriptPubKeyIn,
                    *(CTxMemPool **)((long)&scriptPubKeyIn[4].super_CScriptBase._union + 8),
                    &nPackagesSelected,&nDescendantsUpdated);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&state);
    }
    lVar9 = std::chrono::_V2::steady_clock::now();
    m_last_block_num_txs.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload =
         *(_Storage<long,_true> *)((long)&(scriptPubKeyIn->super_CScriptBase)._union + 0x10);
    if (m_last_block_num_txs.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == false) {
      m_last_block_num_txs.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = true;
    }
    m_last_block_weight.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload =
         *(_Storage<long,_true> *)((long)&(scriptPubKeyIn->super_CScriptBase)._union + 8);
    if (m_last_block_weight.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == false) {
      m_last_block_weight.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = true;
    }
    CMutableTransaction::CMutableTransaction(&coinbaseTx);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&coinbaseTx.vin,1);
    COutPoint::SetNull(&(coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start)->prevout);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&coinbaseTx.vout,1);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((coinbaseTx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,in_RDX);
    pcVar2 = scriptPubKeyIn[1].super_CScriptBase._union.indirect_contents.indirect;
    CVar10 = GetBlockSubsidy(*(int *)((long)&scriptPubKeyIn[3].super_CScriptBase._union + 0x10),
                             (Params *)
                             scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.indirect);
    (coinbaseTx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
     super__Vector_impl_data._M_start)->nValue = (CAmount)(pcVar2 + CVar10);
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = 0;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    this_01 = CScript::push_int64((CScript *)&state,
                                  (long)*(int *)((long)&scriptPubKeyIn[3].super_CScriptBase._union +
                                                0x10));
    other = &CScript::operator<<(this_01,OP_0)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((coinbaseTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,other);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&state);
    std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)&state);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((block->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&state);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &state.super_ValidationState<BlockValidationResult>.m_reject_reason);
    ChainstateManager::GenerateCoinbaseCommitment
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&state,
               *(ChainstateManager **)
                (*(long *)((long)&scriptPubKeyIn[4].super_CScriptBase._union + 0x10) + 0x50),block,
               pindexPrev);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect + 0xa0),&state
              );
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&state);
    **(long **)((scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect + 0x70) =
         -(long)scriptPubKeyIn[1].super_CScriptBase._union.indirect_contents.indirect;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &::TX_NO_WITNESS;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)block;
    sVar11 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                       ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&state);
    log_msg_1._M_dataplus._M_p =
         "\x01/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mini_miner.cpp"
    ;
    log_msg_1._M_string_length = (size_type)block;
    sVar12 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                       ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&log_msg_1);
    local_d8[0] = sVar12 + sVar11 * 3;
    pLVar13 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar13);
    if (bVar3) {
      state.super_ValidationState<BlockValidationResult>._0_8_ =
           &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)0x0;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
           state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length &
           0xffffffffffffff00;
      tinyformat::format<long,unsigned_long,long,unsigned_long>
                (&log_msg_1,
                 (tinyformat *)"CreateNewBlock(): block weight: %u txs: %u fees: %ld sigops %d\n",
                 (char *)local_d8,(long *)((scriptPubKeyIn->super_CScriptBase)._union.direct + 0x10)
                 ,(unsigned_long *)(scriptPubKeyIn + 1),
                 (long *)((scriptPubKeyIn->super_CScriptBase)._union.direct + 0x18),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state,
                 &log_msg_1);
      std::__cxx11::string::~string((string *)&log_msg_1);
      pLVar13 = LogInstance();
      log_msg_1._M_dataplus._M_p = (pointer)0x57;
      log_msg_1._M_string_length = (size_type)anon_var_dwarf_25a5260;
      in_stack_fffffffffffffe40 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
      ;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = (char *)state.super_ValidationState<BlockValidationResult>._0_8_;
      str._M_len = (size_t)state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                           _M_dataplus._M_p;
      logging_function._M_str = "CreateNewBlock";
      logging_function._M_len = 0xe;
      BCLog::Logger::LogPrintStr(pLVar13,str,logging_function,source_file,0xa6,ALL,Info);
      std::__cxx11::string::~string((string *)&state);
    }
    CBlockIndex::GetBlockHash((uint256 *)&state,pindexPrev);
    *(size_type *)
     ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10) =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
    *(size_type *)
     ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18) =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
         _M_allocated_capacity;
    *(undefined8 *)(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems =
         state.super_ValidationState<BlockValidationResult>._0_8_;
    *(pointer *)
     ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8) =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p;
    UpdateTime(&block->super_CBlockHeader,
               (Params *)scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.indirect,
               pindexPrev);
    uVar5 = GetNextWorkRequired(pindexPrev,&block->super_CBlockHeader,
                                (Params *)
                                scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.
                                indirect);
    (block->super_CBlockHeader).nBits = uVar5;
    (block->super_CBlockHeader).nNonce = 0;
    uVar5 = GetLegacySigOpCount((((block->vtx).
                                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
    **(ulong **)((scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect + 0x88) =
         (ulong)(uVar5 << 2);
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
           _M_allocated_capacity & 0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    if (scriptPubKeyIn[6].super_CScriptBase._union.direct[0] == '\x01') {
      bVar3 = TestBlockValidity(&state,(CChainParams *)
                                       scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.
                                       indirect,
                                *(Chainstate **)
                                 ((long)&scriptPubKeyIn[4].super_CScriptBase._union + 0x10),block,
                                pindexPrev,false,false);
      if (!bVar3) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  (&local_78,&state.super_ValidationState<BlockValidationResult>);
        tinyformat::format<char[15],std::__cxx11::string>
                  (&log_msg_1,(tinyformat *)"%s: TestBlockValidity failed: %s","CreateNewBlock",
                   (char (*) [15])&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pindexPrev);
        std::runtime_error::runtime_error(this_02,(string *)&log_msg_1);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_007aeb86;
      }
    }
    lVar14 = std::chrono::_V2::steady_clock::now();
    pLVar13 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar13,BENCH,Debug);
    if (bVar3) {
      local_188 = (double)(lVar9 - lVar6) / 1000000.0;
      local_190 = (double)(lVar14 - lVar9) / 1000000.0;
      local_198 = (double)(lVar14 - lVar6) / 1000000.0;
      pLVar13 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar13);
      if (bVar3) {
        log_msg_1._M_dataplus._M_p = (pointer)&log_msg_1.field_2;
        log_msg_1._M_string_length = 0;
        log_msg_1.field_2._M_local_buf[0] = '\0';
        tinyformat::format<double,int,int,double,double>
                  (&local_78,
                   (tinyformat *)
                   "CreateNewBlock() packages: %.2fms (%d packages, %d updated descendants), validity: %.2fms (total %.2fms)\n"
                   ,(char *)&local_188,(double *)&nPackagesSelected,&nDescendantsUpdated,
                   (int *)&local_190,&local_198,(double *)in_stack_fffffffffffffe40);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg_1,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        pLVar13 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x57;
        local_78._M_string_length = 0xccb500;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
        ;
        source_file_00._M_len = 0x57;
        str_00._M_str = log_msg_1._M_dataplus._M_p;
        str_00._M_len = log_msg_1._M_string_length;
        logging_function_00._M_str = "CreateNewBlock";
        logging_function_00._M_len = 0xe;
        BCLog::Logger::LogPrintStr
                  (pLVar13,str_00,logging_function_00,source_file_00,0xb9,BENCH,Debug);
        std::__cxx11::string::~string((string *)&log_msg_1);
      }
    }
    (this->pblocktemplate)._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         (CBlockTemplate *)(scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect;
    (scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
    ValidationState<BlockValidationResult>::~ValidationState
              (&state.super_ValidationState<BlockValidationResult>);
    CMutableTransaction::~CMutableTransaction(&coinbaseTx);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
            )(__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
              )this;
  }
LAB_007aeb86:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CBlockTemplate> BlockAssembler::CreateNewBlock(const CScript& scriptPubKeyIn)
{
    const auto time_start{SteadyClock::now()};

    resetBlock();

    pblocktemplate.reset(new CBlockTemplate());

    if (!pblocktemplate.get()) {
        return nullptr;
    }
    CBlock* const pblock = &pblocktemplate->block; // pointer for convenience

    // Add dummy coinbase tx as first transaction
    pblock->vtx.emplace_back();
    pblocktemplate->vTxFees.push_back(-1); // updated at end
    pblocktemplate->vTxSigOpsCost.push_back(-1); // updated at end

    LOCK(::cs_main);
    CBlockIndex* pindexPrev = m_chainstate.m_chain.Tip();
    assert(pindexPrev != nullptr);
    nHeight = pindexPrev->nHeight + 1;

    pblock->nVersion = m_chainstate.m_chainman.m_versionbitscache.ComputeBlockVersion(pindexPrev, chainparams.GetConsensus());
    // -regtest only: allow overriding block.nVersion with
    // -blockversion=N to test forking scenarios
    if (chainparams.MineBlocksOnDemand()) {
        pblock->nVersion = gArgs.GetIntArg("-blockversion", pblock->nVersion);
    }

    pblock->nTime = TicksSinceEpoch<std::chrono::seconds>(NodeClock::now());
    m_lock_time_cutoff = pindexPrev->GetMedianTimePast();

    int nPackagesSelected = 0;
    int nDescendantsUpdated = 0;
    if (m_mempool) {
        LOCK(m_mempool->cs);
        addPackageTxs(*m_mempool, nPackagesSelected, nDescendantsUpdated);
    }

    const auto time_1{SteadyClock::now()};

    m_last_block_num_txs = nBlockTx;
    m_last_block_weight = nBlockWeight;

    // Create coinbase transaction.
    CMutableTransaction coinbaseTx;
    coinbaseTx.vin.resize(1);
    coinbaseTx.vin[0].prevout.SetNull();
    coinbaseTx.vout.resize(1);
    coinbaseTx.vout[0].scriptPubKey = scriptPubKeyIn;
    coinbaseTx.vout[0].nValue = nFees + GetBlockSubsidy(nHeight, chainparams.GetConsensus());
    coinbaseTx.vin[0].scriptSig = CScript() << nHeight << OP_0;
    pblock->vtx[0] = MakeTransactionRef(std::move(coinbaseTx));
    pblocktemplate->vchCoinbaseCommitment = m_chainstate.m_chainman.GenerateCoinbaseCommitment(*pblock, pindexPrev);
    pblocktemplate->vTxFees[0] = -nFees;

    LogPrintf("CreateNewBlock(): block weight: %u txs: %u fees: %ld sigops %d\n", GetBlockWeight(*pblock), nBlockTx, nFees, nBlockSigOpsCost);

    // Fill in header
    pblock->hashPrevBlock  = pindexPrev->GetBlockHash();
    UpdateTime(pblock, chainparams.GetConsensus(), pindexPrev);
    pblock->nBits          = GetNextWorkRequired(pindexPrev, pblock, chainparams.GetConsensus());
    pblock->nNonce         = 0;
    pblocktemplate->vTxSigOpsCost[0] = WITNESS_SCALE_FACTOR * GetLegacySigOpCount(*pblock->vtx[0]);

    BlockValidationState state;
    if (m_options.test_block_validity && !TestBlockValidity(state, chainparams, m_chainstate, *pblock, pindexPrev,
                                                            /*fCheckPOW=*/false, /*fCheckMerkleRoot=*/false)) {
        throw std::runtime_error(strprintf("%s: TestBlockValidity failed: %s", __func__, state.ToString()));
    }
    const auto time_2{SteadyClock::now()};

    LogDebug(BCLog::BENCH, "CreateNewBlock() packages: %.2fms (%d packages, %d updated descendants), validity: %.2fms (total %.2fms)\n",
             Ticks<MillisecondsDouble>(time_1 - time_start), nPackagesSelected, nDescendantsUpdated,
             Ticks<MillisecondsDouble>(time_2 - time_1),
             Ticks<MillisecondsDouble>(time_2 - time_start));

    return std::move(pblocktemplate);
}